

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void ARGBCopyYToAlphaRow_C(uint8_t *src,uint8_t *dst,int width)

{
  int iVar1;
  
  if (1 < width) {
    iVar1 = 0;
    do {
      dst[3] = *src;
      dst[7] = src[1];
      dst = dst + 8;
      src = src + 2;
      iVar1 = iVar1 + 2;
    } while (iVar1 < width + -1);
  }
  if ((width & 1U) != 0) {
    dst[3] = *src;
  }
  return;
}

Assistant:

void ARGBCopyYToAlphaRow_C(const uint8_t* src, uint8_t* dst, int width) {
  int i;
  for (i = 0; i < width - 1; i += 2) {
    dst[3] = src[0];
    dst[7] = src[1];
    dst += 8;
    src += 2;
  }
  if (width & 1) {
    dst[3] = src[0];
  }
}